

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O0

void __thiscall OpenMD::SC::initialize(SC *this)

{
  bool bVar1;
  iterator this_00;
  iterator __new_size;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> *in_RDI;
  AtomType *unaff_retaddr;
  iterator at;
  AtomType *in_stack_00000198;
  SC *in_stack_000001a0;
  set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_> *this_01;
  _Self local_38;
  _Base_ptr local_30;
  value_type_conflict1 *in_stack_ffffffffffffffe0;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3b056c);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x3b057a);
  std::vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>::clear
            ((vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_> *)0x3b0588);
  std::
  vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
  ::clear((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
           *)0x3b0599);
  *(undefined4 *)&in_RDI[0x15]._M_node = 0;
  this_01 = (set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_> *
            )(in_RDI + 0xc);
  ForceField::getNAtomType((ForceField *)0x3b05bf);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(0xffffffff,in_stack_fffffffffffffff0),
             (size_type)in_stack_ffffffffffffffe8._M_node,in_stack_ffffffffffffffe0);
  std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)&stack0xffffffffffffffe8);
  this_00 = std::
            set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
            begin(this_01);
  while( true ) {
    __new_size = std::
                 set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                 ::end(this_01);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,(_Self *)&stack0xffffffffffffffd8);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(in_RDI);
    bVar1 = AtomType::isSC(unaff_retaddr);
    if (bVar1) {
      *(int *)&in_RDI[0x15]._M_node = *(int *)&in_RDI[0x15]._M_node + 1;
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++(in_RDI);
  }
  std::vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>::resize
            ((vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_> *)this_00._M_node,
             (size_type)__new_size._M_node);
  std::
  vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
            *)this_00._M_node,(size_type)__new_size._M_node);
  local_30 = (_Base_ptr)
             std::
             set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
             begin(this_01);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
         ::end(this_01);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,&local_38);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(in_RDI);
    bVar1 = AtomType::isSC(unaff_retaddr);
    if (bVar1) {
      std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(in_RDI);
      addType(in_stack_000001a0,in_stack_00000198);
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++(in_RDI);
  }
  *(undefined1 *)&in_RDI[5]._M_node = 1;
  return;
}

Assistant:

void SC::initialize() {
    // find all of the SC atom Types:
    SCtypes.clear();
    SCtids.clear();
    SCdata.clear();
    MixingMap.clear();
    nSC_ = 0;

    SCtids.resize(forceField_->getNAtomType(), -1);

    AtomTypeSet::iterator at;
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isSC()) nSC_++;
    }
    SCdata.resize(nSC_);
    MixingMap.resize(nSC_);
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isSC()) addType((*at));
    }
    initialized_ = true;
  }